

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_charbuffer.h
# Opt level: O1

int __thiscall ST::buffer<char>::compare(buffer<char> *this,buffer<char> *other)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  ulong __n;
  
  uVar1 = this->m_size;
  uVar2 = other->m_size;
  __n = uVar1;
  if (uVar2 < uVar1) {
    __n = uVar2;
  }
  if (__n == 0) {
    iVar4 = 0;
  }
  else {
    iVar4 = memcmp(this->m_chars,other->m_chars,__n);
  }
  iVar3 = (int)uVar1 - (int)uVar2;
  if (iVar4 != 0) {
    iVar3 = iVar4;
  }
  return iVar3;
}

Assistant:

ST_NODISCARD
        size_t size() const noexcept { return m_size; }